

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

void __thiscall vox::nGRP::nGRP(nGRP *this,int32_t vCount)

{
  size_type sVar1;
  value_type_conflict1 local_18;
  int32_t local_14;
  nGRP *pnStack_10;
  int32_t vCount_local;
  nGRP *this_local;
  
  local_14 = vCount;
  pnStack_10 = this;
  DICT::DICT(&this->nodeAttribs);
  std::vector<int,_std::allocator<int>_>::vector(&this->childNodes);
  this->nodeId = 0;
  this->nodeChildrenNodes = local_14;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->childNodes);
    if (this->nodeChildrenNodes <= (int)sVar1) break;
    local_18 = 0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->childNodes,&local_18);
  }
  return;
}

Assistant:

nGRP::nGRP(int32_t vCount) {
    nodeId            = 0;
    nodeChildrenNodes = vCount;
    while ((int32_t)childNodes.size() < nodeChildrenNodes)
        childNodes.push_back(0);
}